

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

void Exa_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  int iVar1;
  Bmc_EsPar_t *pBVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Exa_Man_t *pEVar6;
  abctime aVar7;
  abctime aVar8;
  word *pwVar9;
  word *pIn1;
  word *pIn2;
  abctime time;
  abctime time_00;
  long lVar10;
  ulong uVar11;
  bmcg_sat_solver *s;
  int iMint;
  int local_114;
  Exa_Man_t *local_110;
  ulong local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  bmcg_sat_solver *local_f0;
  abctime local_e8;
  Bmc_EsPar_t *local_e0;
  word *local_d8;
  word *local_d0;
  word *local_c8 [2];
  word pTruth [16];
  
  iMint = 1;
  local_e8 = Abc_Clock();
  Abc_TtReadHex(pTruth,pPars->pTtStr);
  if (10 < pPars->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x327,"void Exa_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  pEVar6 = Exa_ManAlloc(pPars,pTruth);
  local_114 = 0;
  if (((byte)pTruth[0] & 1) != 0) {
    local_114 = 1;
    Abc_TtNot(pTruth,pEVar6->nWords);
  }
  iVar3 = Exa_ManAddCnfStart(pEVar6,pPars->fOnlyAnd);
  if (iVar3 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x32b,"void Exa_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  printf("Running exact synthesis for %d-input function with %d two-input gates...\n",
         (ulong)(uint)pEVar6->nVars,(ulong)(uint)pEVar6->nNodes);
  iVar3 = 1;
  uVar11 = 0;
  local_110 = pEVar6;
  local_e0 = pPars;
  do {
    pBVar2 = local_e0;
    if (iVar3 == -1) {
LAB_0049ff7d:
      iVar3 = local_114;
      Exa_ManPrintSolution(pEVar6,local_114);
      Exa_ManDumpBlif(pEVar6,iVar3);
LAB_0049ff95:
      Exa_ManFree(pEVar6);
      aVar7 = Abc_Clock();
      Abc_PrintTime(0x79ba37,(char *)(aVar7 - local_e8),time_00);
      return;
    }
    aVar7 = Abc_Clock();
    iVar3 = Exa_ManAddCnf(pEVar6,iMint);
    if (iVar3 == 0) {
LAB_0049ff76:
      if (iMint != -1) goto LAB_0049ff95;
      goto LAB_0049ff7d;
    }
    s = pEVar6->pSat;
    iVar3 = bmcg_sat_solver_solve(s,(int *)0x0,0);
    if (pBVar2->fVerbose != 0) {
      printf("Iter %3d : ",uVar11);
      Extra_PrintBinary(_stdout,(uint *)&iMint,pEVar6->nVars);
      printf("  Var =%5d  ",(ulong)(uint)pEVar6->iVar);
      uVar4 = bmcg_sat_solver_clausenum(s);
      printf("Cla =%6d  ",(ulong)uVar4);
      uVar4 = bmcg_sat_solver_conflictnum(s);
      printf("Conf =%9d  ",(ulong)uVar4);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar8 - aVar7),time);
    }
    pEVar6 = local_110;
    local_f0 = s;
    if (iVar3 == 0) {
      printf("The problem timed out after %d sec.\n",(ulong)(uint)pBVar2->RuntimeLim);
      pEVar6 = local_110;
      goto LAB_0049ff76;
    }
    if (iVar3 == -1) {
      puts("The problem has no solution.");
      goto LAB_0049ff76;
    }
    iVar3 = local_110->nVars;
    iVar1 = local_110->nObjs;
    local_108 = 0;
    local_fc = (int)uVar11;
    local_f8 = iVar3;
    for (; pEVar6 = local_110, iVar3 < iVar1; iVar3 = iVar3 + 1) {
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        iVar5 = Exa_ManFindFanin(pEVar6,iVar3,(int)lVar10);
        pwVar9 = Exa_ManTruth(pEVar6,iVar5);
        local_c8[lVar10] = pwVar9;
      }
      pwVar9 = Exa_ManTruth(pEVar6,iVar3);
      local_f4 = pEVar6->nWords;
      Abc_TtConst0(pwVar9,local_f4);
      local_d0 = local_c8[0];
      local_d8 = local_c8[1];
      for (uVar4 = 1; uVar4 != 4; uVar4 = uVar4 + 1) {
        iVar5 = bmcg_sat_solver_read_cex_varvalue(s,(int)local_108 + uVar4);
        pEVar6 = local_110;
        if (iVar5 != 0) {
          pwVar9 = Exa_ManTruth(local_110,iVar1);
          iVar5 = local_f4;
          Abc_TtAndCompl(pwVar9,local_d0,~uVar4 & 1,local_d8,(uint)(uVar4 < 2),local_f4);
          pwVar9 = Exa_ManTruth(pEVar6,iVar3);
          pIn1 = Exa_ManTruth(pEVar6,iVar3);
          pIn2 = Exa_ManTruth(pEVar6,iVar1);
          s = local_f0;
          Abc_TtOr(pwVar9,pIn1,pIn2,iVar5);
        }
      }
      local_108 = (ulong)((int)local_108 + 3);
    }
    pwVar9 = Exa_ManTruth(local_110,iVar1 + -1);
    iVar1 = local_f8;
    iVar3 = Abc_TtFindFirstDiffBit(pwVar9,pEVar6->pTruth,local_f8);
    if (1 << ((byte)iVar1 & 0x1f) <= iVar3) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                    ,0x232,"int Exa_ManEval(Exa_Man_t *)");
    }
    uVar11 = (ulong)(local_fc + 1);
    iMint = iVar3;
  } while( true );
}

Assistant:

void Exa_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    p = Exa_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d two-input gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        if ( status == GLUCOSE_UNDEC )
        {
            printf( "The problem timed out after %d sec.\n", pPars->RuntimeLim );
            break;
        }
        iMint = Exa_ManEval( p );
    }
    if ( iMint == -1 )
    {
        Exa_ManPrintSolution( p, fCompl );
        Exa_ManDumpBlif( p, fCompl );
    }
    Exa_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}